

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.h
# Opt level: O0

void randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>
               (FakeAllocatorUnderTest *allocatorUnderTest,size_t iterCount,size_t maxItems,
               size_t maxItemSizeExp,size_t threadID)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  uint uVar4;
  size_t count;
  ulong uVar5;
  size_t sVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  long *in_FS_OFFSET;
  uint8_t *tail_1;
  size_t i_4;
  size_t idx_4;
  size_t sz_1;
  uint8_t *tail;
  size_t i_3;
  size_t idx_1;
  uint32_t rnum2;
  uint32_t rnum1;
  size_t randNum_1;
  size_t k;
  size_t j_1;
  size_t sz;
  size_t randNumSz;
  size_t j;
  ulong uStack_1a8;
  uint32_t randNum;
  size_t i_2;
  void *local_198;
  TestBin *baseBuff;
  size_t start;
  uint32_t local_180;
  uint local_17c;
  Pareto_80_20_6_Data paretoData;
  size_t dummyCtr;
  bool doFullAccess;
  bool doMemAccess;
  size_t threadID_local;
  size_t maxItemSizeExp_local;
  size_t maxItems_local;
  size_t iterCount_local;
  FakeAllocatorUnderTest *allocatorUnderTest_local;
  size_t i_1;
  size_t i;
  uint32_t *local_f8;
  ulong local_f0;
  unsigned_long_long x_3;
  unsigned_long_long c_3;
  unsigned_long_long x_2;
  unsigned_long_long c_2;
  unsigned_long_long x_1;
  unsigned_long_long c_1;
  unsigned_long_long x;
  unsigned_long_long c;
  uint64_t szMask_1;
  size_t *local_a0;
  long local_98;
  unsigned_long idx_3;
  anon_class_8_1_60f0ca16 aStack_88;
  uint32_t statClassBase_1;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  uint64_t szMask;
  size_t *local_60;
  long local_58;
  unsigned_long idx;
  anon_class_8_1_60f0ca16 aStack_48;
  uint32_t statClassBase;
  size_t local_40;
  ulong local_38;
  ulong local_30;
  size_t offsetInRange;
  long lStack_20;
  uint32_t rangeSize;
  size_t idx_2;
  uint32_t *local_10;
  
  maxItemSizeExp_local = maxItems;
  maxItems_local = iterCount;
  iterCount_local = (size_t)allocatorUnderTest;
  FakeAllocatorUnderTest::init(allocatorUnderTest,(EVP_PKEY_CTX *)threadID);
  paretoData.offsets[6] = 0;
  paretoData.offsets[7] = 0;
  start = (size_t)&maxItemSizeExp_local;
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>(FakeAllocatorUnderTest&,unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
             ,0x1de,(anon_class_8_1_ff09363a *)&start,"maxItems <= UINT32_MAX");
  local_f8 = &local_180;
  i._4_4_ = (uint32_t)maxItemSizeExp_local;
  local_180 = 0x431bde82;
  paretoData.probabilityRanges[3] = 0xfffbce41;
  for (i_1 = 1; i_1 < 5; i_1 = i_1 + 1) {
    local_f8[i_1] =
         *(int *)((long)&start + i_1 * 4 + 4) + (int)(long)(Pareto_80_20_6[i_1] * 4294967295.0);
  }
  paretoData.probabilityRanges[4] = 0;
  for (allocatorUnderTest_local = (FakeAllocatorUnderTest *)0x0;
      allocatorUnderTest_local < (FakeAllocatorUnderTest *)0x6;
      allocatorUnderTest_local =
           (FakeAllocatorUnderTest *)((long)&allocatorUnderTest_local->testRes + 1)) {
    paretoData.probabilityRanges[(long)((long)&allocatorUnderTest_local->testRes + 5)] =
         paretoData.probabilityRanges[(long)((long)&allocatorUnderTest_local->testRes + 4)] +
         (int)(long)((double)(maxItemSizeExp_local & 0xffffffff) *
                    Pareto_80_20_6[6 - (long)allocatorUnderTest_local]);
  }
  paretoData.offsets[5] = i._4_4_;
  baseBuff = (TestBin *)GetMillisecondCount();
  local_198 = (void *)0x0;
  bVar3 = FakeAllocatorUnderTest::isFake();
  if (bVar3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = maxItemSizeExp_local;
    count = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      count = 0xffffffffffffffff;
    }
    local_198 = operator_new__(count);
  }
  else {
    local_198 = FakeAllocatorUnderTest::allocate
                          ((FakeAllocatorUnderTest *)iterCount_local,maxItemSizeExp_local << 4);
  }
  i_2 = (size_t)&local_198;
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>(FakeAllocatorUnderTest&,unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
             ,0x1ee,(anon_class_8_1_81482042 *)&i_2,"baseBuff");
  memset(local_198,0,maxItemSizeExp_local << 4);
  for (uStack_1a8 = 0; uStack_1a8 < maxItemSizeExp_local >> 5; uStack_1a8 = uStack_1a8 + 1) {
    x = 0x6595a395a1ec5333;
    uVar5 = *(ulong *)(*in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
    *(ulong *)(*in_FS_OFFSET + -0x28) = uVar5;
    uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
    uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
    c_1 = uVar5 >> 0x20 ^ uVar5;
    uVar4 = (uint)c_1;
    for (randNumSz = 0; randNumSz < 0x20; randNumSz = randNumSz + 1) {
      if ((uVar4 >> ((byte)randNumSz & 0x1f) & 1) != 0) {
        x_1 = 0x6595a395a1ec5333;
        uVar5 = *(ulong *)(*in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
        *(ulong *)(*in_FS_OFFSET + -0x28) = uVar5;
        uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
        uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
        c_2 = uVar5 >> 0x20 ^ uVar5;
        aStack_48.maxSizeExp = &local_40;
        local_40 = maxItemSizeExp;
        local_38 = c_2;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x58,&stack0xffffffffffffffb8,"maxSizeExp >= 3");
        local_40 = local_40 - 3;
        idx._4_4_ = ((uint)local_38 & (int)(1L << ((byte)local_40 & 0x3f)) - 1U) + 1;
        local_38 = local_38 >> ((byte)local_40 & 0x3f);
        iVar2 = 0;
        for (uVar5 = (ulong)idx._4_4_; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
          iVar2 = iVar2 + 1;
        }
        local_58 = (long)iVar2;
        szMask = (uint64_t)&local_58;
        local_60 = &local_40;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_2_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x66,(anon_class_16_2_280ae672 *)&szMask,"idx <= maxSizeExp");
        local_58 = local_58 + 2;
        local_70 = (1L << ((byte)local_58 & 0x3f)) - 1;
        sVar6 = (local_38 & local_70) + 1 + (1L << ((byte)local_58 & 0x3f));
        *(size_t *)((long)local_198 + (uStack_1a8 * 0x20 + randNumSz) * 0x10 + 8) = sVar6;
        pvVar7 = FakeAllocatorUnderTest::allocate((FakeAllocatorUnderTest *)iterCount_local,sVar6);
        *(void **)((long)local_198 + (uStack_1a8 * 0x20 + randNumSz) * 0x10) = pvVar7;
        memset(*(void **)((long)local_198 + (uStack_1a8 * 0x20 + randNumSz) * 0x10),
               (uint)(byte)sVar6,sVar6);
      }
    }
  }
  FakeAllocatorUnderTest::doWhateverAfterSetupPhase((FakeAllocatorUnderTest *)iterCount_local);
  for (k = 0; k < maxItems_local / 10000; k = k + 1) {
    for (randNum_1 = 0; randNum_1 < 10000; randNum_1 = randNum_1 + 1) {
      x_2 = 0x6595a395a1ec5333;
      uVar5 = *(ulong *)(*in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
      *(ulong *)(*in_FS_OFFSET + -0x28) = uVar5;
      uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
      uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
      c_3 = uVar5 >> 0x20 ^ uVar5;
      idx_2._4_4_ = (uint)c_3;
      idx_2._0_4_ = (uint)(uVar5 >> 0x20);
      local_10 = &local_180;
      lStack_20 = 6;
      if (idx_2._4_4_ < local_180) {
        lStack_20 = 0;
      }
      else if (idx_2._4_4_ < local_17c) {
        lStack_20 = 1;
      }
      else if (idx_2._4_4_ < paretoData.probabilityRanges[0]) {
        lStack_20 = 2;
      }
      else if (idx_2._4_4_ < paretoData.probabilityRanges[1]) {
        lStack_20 = 3;
      }
      else if (idx_2._4_4_ < paretoData.probabilityRanges[2]) {
        lStack_20 = 4;
      }
      else if (idx_2._4_4_ < paretoData.probabilityRanges[3]) {
        lStack_20 = 5;
      }
      offsetInRange._4_4_ =
           paretoData.probabilityRanges[lStack_20 + 5] - paretoData.probabilityRanges[lStack_20 + 4]
      ;
      local_30 = (ulong)(uint)idx_2 % (ulong)offsetInRange._4_4_;
      lVar8 = paretoData.probabilityRanges[lStack_20 + 4] + local_30;
      if (*(long *)((long)local_198 + lVar8 * 0x10) == 0) {
        x_3 = 0x6595a395a1ec5333;
        uVar5 = *(ulong *)(*in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
        *(ulong *)(*in_FS_OFFSET + -0x28) = uVar5;
        uVar5 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
        local_f0 = (uVar5 >> 0x20 ^ uVar5) * 0x6595a395a1ec5333;
        local_f0 = local_f0 >> 0x20 ^ local_f0;
        aStack_88.maxSizeExp = &local_80;
        local_80 = maxItemSizeExp;
        local_78 = local_f0;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x58,&stack0xffffffffffffff78,"maxSizeExp >= 3");
        local_80 = local_80 - 3;
        idx_3._4_4_ = ((uint)local_78 & (int)(1L << ((byte)local_80 & 0x3f)) - 1U) + 1;
        local_78 = local_78 >> ((byte)local_80 & 0x3f);
        iVar2 = 0;
        for (uVar5 = (ulong)idx_3._4_4_; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000)
        {
          iVar2 = iVar2 + 1;
        }
        local_98 = (long)iVar2;
        szMask_1 = (uint64_t)&local_98;
        local_a0 = &local_80;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_2_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x66,(anon_class_16_2_280ae672 *)&szMask_1,"idx <= maxSizeExp");
        local_98 = local_98 + 2;
        c = (1L << ((byte)local_98 & 0x3f)) - 1;
        sVar6 = (local_78 & c) + 1 + (1L << ((byte)local_98 & 0x3f));
        *(size_t *)((long)local_198 + lVar8 * 0x10 + 8) = sVar6;
        pvVar7 = FakeAllocatorUnderTest::allocate((FakeAllocatorUnderTest *)iterCount_local,sVar6);
        *(void **)((long)local_198 + lVar8 * 0x10) = pvVar7;
        memset(*(void **)((long)local_198 + lVar8 * 0x10),(uint)(byte)sVar6,sVar6);
      }
      else {
        for (tail = (uint8_t *)0x0;
            tail < (uint8_t *)(*(ulong *)((long)local_198 + lVar8 * 0x10 + 8) >> 3); tail = tail + 1
            ) {
          paretoData.offsets._24_8_ =
               *(long *)(*(long *)((long)local_198 + lVar8 * 0x10) + (long)tail * 8) +
               paretoData.offsets._24_8_;
        }
        lVar9 = (long)tail * 8;
        for (tail = (uint8_t *)0x0;
            tail < (uint8_t *)(*(ulong *)((long)local_198 + lVar8 * 0x10 + 8) & 7); tail = tail + 1)
        {
          paretoData.offsets._24_8_ =
               (ulong)tail[*(long *)((long)local_198 + lVar8 * 0x10) + lVar9] +
               paretoData.offsets._24_8_;
        }
        FakeAllocatorUnderTest::deallocate
                  ((FakeAllocatorUnderTest *)iterCount_local,
                   *(void **)((long)local_198 + lVar8 * 0x10));
        *(undefined8 *)((long)local_198 + lVar8 * 0x10) = 0;
      }
    }
    FakeAllocatorUnderTest::doWhateverWithinMainLoopPhase((FakeAllocatorUnderTest *)iterCount_local)
    ;
  }
  FakeAllocatorUnderTest::doWhateverAfterMainLoopPhase((FakeAllocatorUnderTest *)iterCount_local);
  for (i_4 = 0; i_4 < maxItemSizeExp_local; i_4 = i_4 + 1) {
    if (*(long *)((long)local_198 + i_4 * 0x10) != 0) {
      for (tail_1 = (uint8_t *)0x0;
          tail_1 < (uint8_t *)(*(ulong *)((long)local_198 + i_4 * 0x10 + 8) >> 3);
          tail_1 = tail_1 + 1) {
        paretoData.offsets._24_8_ =
             *(long *)(*(long *)((long)local_198 + i_4 * 0x10) + (long)tail_1 * 8) +
             paretoData.offsets._24_8_;
      }
      lVar8 = (long)tail_1 * 8;
      for (tail_1 = (uint8_t *)0x0;
          tail_1 < (uint8_t *)(*(ulong *)((long)local_198 + i_4 * 0x10 + 8) & 7);
          tail_1 = tail_1 + 1) {
        paretoData.offsets._24_8_ =
             (ulong)tail_1[*(long *)((long)local_198 + i_4 * 0x10) + lVar8] +
             paretoData.offsets._24_8_;
      }
      FakeAllocatorUnderTest::deallocate
                ((FakeAllocatorUnderTest *)iterCount_local,*(void **)((long)local_198 + i_4 * 0x10))
      ;
    }
  }
  bVar3 = FakeAllocatorUnderTest::isFake();
  if (bVar3) {
    if (local_198 != (void *)0x0) {
      operator_delete__(local_198);
    }
  }
  else {
    FakeAllocatorUnderTest::deallocate((FakeAllocatorUnderTest *)iterCount_local,local_198);
  }
  FakeAllocatorUnderTest::deinit((FakeAllocatorUnderTest *)iterCount_local);
  FakeAllocatorUnderTest::doWhateverAfterCleanupPhase((FakeAllocatorUnderTest *)iterCount_local);
  nodecpp::log::default_log::info<char_const*,unsigned_long,unsigned_long,unsigned_long>
            ("about to exit thread {} ({} operations performed) [ctr = {}]...",threadID,
             maxItems_local,paretoData.offsets._24_8_);
  return;
}

Assistant:

void randomPos_RandomSize( AllocatorUnderTest& allocatorUnderTest, size_t iterCount, size_t maxItems, size_t maxItemSizeExp, size_t threadID )
{
	constexpr bool doMemAccess = mat != MEM_ACCESS_TYPE::none;
	constexpr bool doFullAccess = mat == MEM_ACCESS_TYPE::full;
//	nodecpp::log::default_log::info( "rnd_seed = {}, iterCount = {}, maxItems = {}, maxItemSizeExp = {}", rnd_seed, iterCount, maxItems, maxItemSizeExp );
	allocatorUnderTest.init( threadID );

	size_t dummyCtr = 0;

	Pareto_80_20_6_Data paretoData;
	NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, maxItems <= UINT32_MAX );
	Pareto_80_20_6_Init( paretoData, (uint32_t)maxItems );

	size_t start = GetMillisecondCount();

	struct TestBin
	{
		uint8_t* ptr;
		size_t sz;
	};

	TestBin* baseBuff = nullptr; 
	if ( !allocatorUnderTest.isFake() )
		baseBuff = reinterpret_cast<TestBin*>( allocatorUnderTest.allocate( maxItems * sizeof(TestBin) ) );
	else
		baseBuff = new TestBin [ maxItems ]; // just using standard allocator
	NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, baseBuff );
	memset( baseBuff, 0, maxItems * sizeof( TestBin ) );

	// setup (saturation)
	for ( size_t i=0;i<maxItems/32; ++i )
	{
		uint32_t randNum = (uint32_t)( rng64() );
		for ( size_t j=0; j<32; ++j )
			if ( (randNum >> j) & 1 )
			{
				size_t randNumSz = rng64();
				size_t sz = calcSizeWithStatsAdjustment( randNumSz, maxItemSizeExp );
				baseBuff[i*32+j].sz = sz;
				baseBuff[i*32+j].ptr = reinterpret_cast<uint8_t*>( allocatorUnderTest.allocate( sz ) );
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
						memset( baseBuff[i*32+j].ptr, (uint8_t)sz, sz );
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						baseBuff[i*32+j].ptr[sz/2] = (uint8_t)sz;
					}
				}
			}
	}
	allocatorUnderTest.doWhateverAfterSetupPhase();

	// main loop
	for ( size_t j=0;j<iterCount/10000; ++j )
	{
		for ( size_t k=0;k<10000; ++k )
		{
			size_t randNum = rng64();
	//		size_t idx = randNum % maxItems;
			uint32_t rnum1 = (uint32_t)randNum;
			uint32_t rnum2 = (uint32_t)(randNum >> 32);
			size_t idx = Pareto_80_20_6_Rand( paretoData, rnum1, rnum2 );
			if ( baseBuff[idx].ptr )
			{
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
					{
						size_t i=0;
						for ( ; i<baseBuff[idx].sz/sizeof(size_t ); ++i )
							dummyCtr += ( reinterpret_cast<size_t*>( baseBuff[idx].ptr) )[i];
						uint8_t* tail = baseBuff[idx].ptr + i * sizeof(size_t );
						for ( i=0; i<baseBuff[idx].sz % sizeof(size_t); ++i )
							dummyCtr += tail[i];
					}
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						dummyCtr += baseBuff[idx].ptr[baseBuff[idx].sz/2];
					}
				}
				allocatorUnderTest.deallocate( baseBuff[idx].ptr );
				baseBuff[idx].ptr = 0;
			}
			else
			{
				size_t sz = calcSizeWithStatsAdjustment( rng64(), maxItemSizeExp );
				baseBuff[idx].sz = sz;
				baseBuff[idx].ptr = reinterpret_cast<uint8_t*>( allocatorUnderTest.allocate( sz ) );
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
						memset( baseBuff[idx].ptr, (uint8_t)sz, sz );
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						baseBuff[idx].ptr[sz/2] = (uint8_t)sz;
					}
				}
			}
		}
		allocatorUnderTest.doWhateverWithinMainLoopPhase();
	}
	allocatorUnderTest.doWhateverAfterMainLoopPhase();

	// exit
	for ( size_t idx=0; idx<maxItems; ++idx )
		if ( baseBuff[idx].ptr )
		{
			if constexpr ( doMemAccess )
			{
				if constexpr ( doFullAccess )
				{
					size_t i=0;
					for ( ; i<baseBuff[idx].sz/sizeof(size_t ); ++i )
						dummyCtr += ( reinterpret_cast<size_t*>( baseBuff[idx].ptr) )[i];
					uint8_t* tail = baseBuff[idx].ptr + i * sizeof(size_t );
					for ( i=0; i<baseBuff[idx].sz % sizeof(size_t); ++i )
						dummyCtr += tail[i];
				}
				else
				{
					static_assert( mat == MEM_ACCESS_TYPE::single, "" );
					dummyCtr += baseBuff[idx].ptr[baseBuff[idx].sz/2];
				}
			}
			allocatorUnderTest.deallocate( baseBuff[idx].ptr );
		}

	if ( !allocatorUnderTest.isFake() )
		allocatorUnderTest.deallocate( baseBuff );
	else
		delete [] baseBuff;
	allocatorUnderTest.deinit();
	allocatorUnderTest.doWhateverAfterCleanupPhase();
		
	nodecpp::log::default_log::info( "about to exit thread {} ({} operations performed) [ctr = {}]...", threadID, iterCount, dummyCtr );
}